

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

void __thiscall DataBuffer::checkSpace(DataBuffer *this,int bytes)

{
  int iVar1;
  int *piVar2;
  char **ppcVar3;
  ulong uVar4;
  char *local_38;
  char *local_30;
  char *local_28;
  char *buf;
  int newsize;
  int oldsize;
  int writesize;
  int bytes_local;
  DataBuffer *this_local;
  
  oldsize = bytes;
  _writesize = this;
  newsize = writtenSize(this);
  iVar1 = newsize + oldsize;
  piVar2 = allocatedSize(this);
  if (*piVar2 <= iVar1) {
    piVar2 = allocatedSize(this);
    buf._4_4_ = *piVar2;
    buf._0_4_ = buf._4_4_ + oldsize + 0x200;
    ppcVar3 = buffer(this);
    local_28 = *ppcVar3;
    uVar4 = (ulong)(int)buf;
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_30 = (char *)operator_new__(uVar4);
    setBuffer(this,&local_30);
    setAllocatedSize(this,(int *)&buf);
    memcpy(this->m_buffer,local_28,(long)buf._4_4_);
    ppcVar3 = buffer(this);
    local_38 = *ppcVar3 + newsize;
    setPosition(this,&local_38);
    if (local_28 != (char *)0x0) {
      operator_delete(local_28);
    }
  }
  return;
}

Assistant:

void DataBuffer::checkSpace (int bytes)
{
	int writesize = writtenSize();

	if (writesize + bytes < allocatedSize())
		return;

	// We don't have enough space in the buffer to write
	// the stuff - thus resize.

	// Remake the buffer with the new size. Have enough space
	// for the stuff we're going to write, as well as a bit
	// of leeway so we don't have to resize immediately again.

	int oldsize = allocatedSize();
	int newsize = oldsize + bytes + 512;

	char* buf = buffer();
	setBuffer (new char[newsize]);
	setAllocatedSize (newsize);

	// Now, copy the stuff back.
	std::memcpy (m_buffer, buf, oldsize);
	setPosition (buffer() + writesize);

	delete buf;
}